

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# possible-contents.h
# Opt level: O0

void __thiscall wasm::PossibleContents::combine(PossibleContents *this,PossibleContents *other)

{
  PossibleContents local_38;
  PossibleContents *local_18;
  PossibleContents *other_local;
  PossibleContents *this_local;
  
  local_18 = other;
  other_local = this;
  wasm::PossibleContents::combine(&local_38,this);
  operator=(this,&local_38);
  ~PossibleContents(&local_38);
  return;
}

Assistant:

void combine(const PossibleContents& other) {
    *this = PossibleContents::combine(*this, other);
  }